

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<bool_(const_bool_&),_chaiscript::dispatch::detail::Fun_Caller<bool,_const_bool_&>_>
::Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<bool_(const_bool_&),_chaiscript::dispatch::detail::Fun_Caller<bool,_const_bool_&>_>
           *this,Fun_Caller<bool,_const_bool_&> f)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  _func_bool_bool_ptr *in_stack_00000028;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_stack_ffffffffffffffd0;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_stack_ffffffffffffffd8;
  Proxy_Function_Impl_Base *in_stack_ffffffffffffffe0;
  
  dispatch::detail::build_param_type_list<bool,bool_const&>(in_stack_00000028);
  Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector
            (in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__Proxy_Function_Callable_Impl_005c8a78;
  in_RDI[5] = in_RSI;
  return;
}

Assistant:

Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr))),
            m_f(std::move(f))
        {
        }